

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O0

void __thiscall
PDFStream::PDFStream
          (PDFStream *this,bool inCompressStream,IByteWriterWithPosition *inOutputStream,
          EncryptionHelper *inEncryptionHelper,ObjectIDType inExtentObjectID,
          IObjectsContextExtender *inObjectsContextExtender)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  IByteWriterWithPosition *pIVar4;
  IByteWriter *pIVar5;
  IByteWriter *local_b8;
  IByteWriterWithPosition *local_b0;
  IByteWriterWithPosition *local_98;
  IObjectsContextExtender *inObjectsContextExtender_local;
  ObjectIDType inExtentObjectID_local;
  EncryptionHelper *inEncryptionHelper_local;
  IByteWriterWithPosition *inOutputStream_local;
  bool inCompressStream_local;
  PDFStream *this_local;
  
  OutputFlateEncodeStream::OutputFlateEncodeStream(&this->mFlateEncodingStream);
  MyStringBuf::MyStringBuf(&this->mTemporaryStream);
  OutputStringBufferStream::OutputStringBufferStream(&this->mTemporaryOutputStream);
  this->mExtender = inObjectsContextExtender;
  this->mCompressStream = inCompressStream;
  this->mExtendObjectID = inExtentObjectID;
  iVar3 = (*(inOutputStream->super_IByteWriter)._vptr_IByteWriter[3])();
  this->mStreamStartPosition = CONCAT44(extraout_var,iVar3);
  this->mOutputStream = inOutputStream;
  if ((inEncryptionHelper == (EncryptionHelper *)0x0) ||
     (bVar1 = EncryptionHelper::IsEncrypting(inEncryptionHelper), !bVar1)) {
    this->mEncryptionStream = (IByteWriterWithPosition *)0x0;
  }
  else {
    pIVar4 = EncryptionHelper::CreateEncryptionStream(inEncryptionHelper,inOutputStream);
    this->mEncryptionStream = pIVar4;
  }
  this->mStreamLength = 0;
  this->mStreamDictionaryContextForDirectExtentStream = (DictionaryContext *)0x0;
  if ((this->mCompressStream & 1U) == 0) {
    local_b8 = &inOutputStream->super_IByteWriter;
    if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
      local_b8 = &this->mEncryptionStream->super_IByteWriter;
    }
    this->mWriteStream = local_b8;
  }
  else if ((this->mExtender == (IObjectsContextExtender *)0x0) ||
          (bVar2 = (**(code **)(*(long *)this->mExtender + 0x10))(), (bVar2 & 1) == 0)) {
    local_b0 = inOutputStream;
    if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
      local_b0 = this->mEncryptionStream;
    }
    OutputFlateEncodeStream::Assign(&this->mFlateEncodingStream,local_b0,true);
    this->mWriteStream = (IByteWriter *)&this->mFlateEncodingStream;
  }
  else {
    local_98 = inOutputStream;
    if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
      local_98 = this->mEncryptionStream;
    }
    pIVar5 = (IByteWriter *)(**(code **)(*(long *)this->mExtender + 0x18))(this->mExtender,local_98)
    ;
    this->mWriteStream = pIVar5;
  }
  return;
}

Assistant:

PDFStream::PDFStream(bool inCompressStream,
					 IByteWriterWithPosition* inOutputStream,
					 EncryptionHelper* inEncryptionHelper,
					 ObjectIDType inExtentObjectID,
					 IObjectsContextExtender* inObjectsContextExtender)
{
	mExtender = inObjectsContextExtender;
	mCompressStream = inCompressStream;
	mExtendObjectID = inExtentObjectID;	
	mStreamStartPosition = inOutputStream->GetCurrentPosition();
	mOutputStream = inOutputStream;
	if (inEncryptionHelper && inEncryptionHelper->IsEncrypting()) {
		mEncryptionStream = inEncryptionHelper->CreateEncryptionStream(inOutputStream);
	}
	else {
		mEncryptionStream = NULL;
	}

	mStreamLength = 0;
    mStreamDictionaryContextForDirectExtentStream = NULL;


	if(mCompressStream)
	{
		if(mExtender && mExtender->OverridesStreamCompression())
		{
			mWriteStream = mExtender->GetCompressionWriteStream(mEncryptionStream ? mEncryptionStream:inOutputStream);
		}
		else
		{
			mFlateEncodingStream.Assign(mEncryptionStream ? mEncryptionStream : inOutputStream);
			mWriteStream = &mFlateEncodingStream;
		}
	}
	else
		mWriteStream = mEncryptionStream ? mEncryptionStream : inOutputStream;

}